

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

string * __thiscall
pbrt::CloudMediumProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CloudMediumProvider *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Bounds3<float>const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ CloudMediumProvider bounds: %s density: %f wispiness: %f frequency: %f ]",
             &this->bounds,&this->density,&this->wispiness,&this->frequency);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ CloudMediumProvider bounds: %s density: %f "
                            "wispiness: %f frequency: %f ]",
                            bounds, density, wispiness, frequency);
    }